

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# palobjbase.cpp
# Opt level: O1

void __thiscall CorUnix::CPalObjectBase::~CPalObjectBase(CPalObjectBase *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

CPalObjectBase::~CPalObjectBase()
{
    ENTRY("CPalObjectBase::~CPalObjectBase(this = %p)\n", this);

    if (NULL != m_pvImmutableData)
    {
        InternalFree(m_pvImmutableData);
    }

    if (NULL != m_pvLocalData)
    {
        InternalFree(m_pvLocalData);
    }

    if (NULL != m_oa.sObjectName.GetString())
    {
        m_oa.sObjectName.FreeBuffer();
    }

    LOGEXIT("CPalObjectBase::~CPalObjectBase\n");
}